

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

CategoricalMapping * __thiscall
CoreML::Specification::Model::mutable_categoricalmapping(Model *this)

{
  CategoricalMapping *this_00;
  
  if (this->_oneof_case_[0] == 0x25e) {
    this_00 = (CategoricalMapping *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x25e;
    this_00 = (CategoricalMapping *)operator_new(0x30);
    CategoricalMapping::CategoricalMapping(this_00);
    (this->Type_).categoricalmapping_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CategoricalMapping* Model::mutable_categoricalmapping() {
  if (!has_categoricalmapping()) {
    clear_Type();
    set_has_categoricalmapping();
    Type_.categoricalmapping_ = new ::CoreML::Specification::CategoricalMapping;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.categoricalMapping)
  return Type_.categoricalmapping_;
}